

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Detail::Approx::setMargin(Approx *this,double newMargin)

{
  ReusableStringStream *pRVar1;
  string *in_RDI;
  double in_XMM0_Qa;
  char (*in_stack_ffffffffffffff78) [40];
  ReusableStringStream *in_stack_ffffffffffffff80;
  ReusableStringStream *in_stack_ffffffffffffffb0;
  
  if (in_XMM0_Qa < 0.0) {
    ReusableStringStream::ReusableStringStream(in_stack_ffffffffffffffb0);
    ReusableStringStream::operator<<
              (in_stack_ffffffffffffff80,(char (*) [25])in_stack_ffffffffffffff78);
    ReusableStringStream::operator<<(in_stack_ffffffffffffff80,(double *)in_stack_ffffffffffffff78);
    pRVar1 = ReusableStringStream::operator<<(in_stack_ffffffffffffff80,*in_stack_ffffffffffffff78);
    pRVar1 = ReusableStringStream::operator<<(pRVar1,in_stack_ffffffffffffff78);
    ReusableStringStream::str_abi_cxx11_(pRVar1);
    throw_domain_error(in_RDI);
  }
  in_RDI->_M_string_length = (size_type)in_XMM0_Qa;
  return;
}

Assistant:

void Approx::setMargin(double newMargin) {
        CATCH_ENFORCE(newMargin >= 0,
            "Invalid Approx::margin: " << newMargin << '.'
            << " Approx::Margin has to be non-negative.");
        m_margin = newMargin;
    }